

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void aom_get_var_sse_sum_16x16_dual_c
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,
               uint32_t *sse16x16,uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  long in_stack_00000010;
  int i;
  int k;
  int sum16x16 [2];
  int local_40;
  int local_3c;
  int local_38 [2];
  int *local_30;
  int *local_28;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_38,0,8);
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    variance((uint8_t *)(local_8 + (local_3c << 4)),local_c,(uint8_t *)(local_18 + (local_3c << 4)),
             local_1c,0x10,0x10,(uint32_t *)(local_28 + local_3c),local_38 + local_3c);
  }
  *local_30 = *local_28 + local_28[1] + *local_30;
  *in_stack_00000008 = local_38[0] + local_38[1] + *in_stack_00000008;
  for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
    *(int *)(in_stack_00000010 + (long)local_40 * 4) =
         local_28[local_40] -
         (int)((ulong)((long)local_38[local_40] * (long)local_38[local_40]) >> 8);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_c(const uint8_t *src_ptr, int source_stride,
                                      const uint8_t *ref_ptr, int ref_stride,
                                      uint32_t *sse16x16, unsigned int *tot_sse,
                                      int *tot_sum, uint32_t *var16x16) {
  int sum16x16[2] = { 0 };
  // Loop over two consecutive 16x16 blocks and process as one 16x32 block.
  for (int k = 0; k < 2; k++) {
    variance(src_ptr + (k * 16), source_stride, ref_ptr + (k * 16), ref_stride,
             16, 16, &sse16x16[k], &sum16x16[k]);
  }

  // Calculate variance at 16x16 level and total sse, sum of 16x32 block.
  *tot_sse += sse16x16[0] + sse16x16[1];
  *tot_sum += sum16x16[0] + sum16x16[1];
  for (int i = 0; i < 2; i++)
    var16x16[i] =
        sse16x16[i] - (uint32_t)(((int64_t)sum16x16[i] * sum16x16[i]) >> 8);
}